

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O0

void Cec_ManSeqDeriveInfoInitRandom(Vec_Ptr_t *vInfo,Gia_Man_t *pAig,Abc_Cex_t *pCex)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  undefined4 uVar6;
  bool bVar7;
  int local_30;
  int nWords;
  int w;
  int k;
  uint *pInfo;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *pAig_local;
  Vec_Ptr_t *vInfo_local;
  
  iVar1 = Vec_PtrReadWordsSimInfo(vInfo);
  if ((pCex != (Abc_Cex_t *)0x0) && (iVar2 = Gia_ManRegNum(pAig), iVar2 != pCex->nRegs)) {
    __assert_fail("pCex == NULL || Gia_ManRegNum(pAig) == pCex->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                  ,0x6d,"void Cec_ManSeqDeriveInfoInitRandom(Vec_Ptr_t *, Gia_Man_t *, Abc_Cex_t *)"
                 );
  }
  iVar2 = Gia_ManRegNum(pAig);
  iVar3 = Vec_PtrSize(vInfo);
  if (iVar3 < iVar2) {
    __assert_fail("Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                  ,0x6e,"void Cec_ManSeqDeriveInfoInitRandom(Vec_Ptr_t *, Gia_Man_t *, Abc_Cex_t *)"
                 );
  }
  for (nWords = 0; iVar2 = Gia_ManRegNum(pAig), nWords < iVar2; nWords = nWords + 1) {
    pvVar5 = Vec_PtrEntry(vInfo,nWords);
    for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
      bVar7 = false;
      if (pCex != (Abc_Cex_t *)0x0) {
        iVar2 = Abc_InfoHasBit((uint *)(pCex + 1),nWords);
        bVar7 = iVar2 != 0;
      }
      uVar6 = 0;
      if (bVar7) {
        uVar6 = 0xffffffff;
      }
      *(undefined4 *)((long)pvVar5 + (long)local_30 * 4) = uVar6;
    }
  }
  for (; iVar2 = Vec_PtrSize(vInfo), nWords < iVar2; nWords = nWords + 1) {
    pvVar5 = Vec_PtrEntry(vInfo,nWords);
    for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
      uVar4 = Gia_ManRandom(0);
      *(uint *)((long)pvVar5 + (long)local_30 * 4) = uVar4;
    }
  }
  return;
}

Assistant:

void Cec_ManSeqDeriveInfoInitRandom( Vec_Ptr_t * vInfo, Gia_Man_t * pAig, Abc_Cex_t * pCex )
{
    unsigned * pInfo;
    int k, w, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    assert( pCex == NULL || Gia_ManRegNum(pAig) == pCex->nRegs );
    assert( Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo) );
    for ( k = 0; k < Gia_ManRegNum(pAig); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = (pCex && Abc_InfoHasBit(pCex->pData, k))? ~0 : 0;
    }

    for ( ; k < Vec_PtrSize(vInfo); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom( 0 );
    }
}